

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O3

void alEventControlSOFT(ALsizei count,ALenum *types,ALboolean enable)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ALenum *pAVar6;
  int *piVar7;
  long lVar8;
  bool bVar9;
  ContextRef context;
  ALCcontext *local_20;
  
  uVar1 = (ulong)(uint)count;
  GetContextRef();
  if (local_20 == (ALCcontext *)0x0) {
    return;
  }
  if (count < 0) {
    ALCcontext::setError(local_20,0xa003,"Controlling %d events",uVar1);
    goto LAB_0011e867;
  }
  if (count == 0) goto LAB_0011e867;
  if (types == (ALenum *)0x0) {
    ALCcontext::setError(local_20,0xa003,"NULL pointer");
    goto LAB_0011e867;
  }
  uVar5 = 0;
  pAVar6 = types;
  if (3 < (uint)count) {
    pAVar6 = (ALenum *)((uVar1 * 4 & 0x1fffffff0) + (long)types);
    lVar8 = (ulong)((uint)count >> 2) + 1;
    piVar7 = types + 2;
    uVar5 = 0;
    do {
      if (2 < piVar7[-2] - 0x19a4U) {
        piVar7 = piVar7 + -2;
        goto LAB_0011e7db;
      }
      uVar5 = uVar5 | *(uint *)(&DAT_001728f0 + (ulong)(piVar7[-2] - 0x19a4U) * 4);
      if (2 < piVar7[-1] - 0x19a4U) {
        piVar7 = piVar7 + -1;
        goto LAB_0011e7db;
      }
      uVar5 = uVar5 | *(uint *)(&DAT_001728f0 + (ulong)(piVar7[-1] - 0x19a4U) * 4);
      if (2 < *piVar7 - 0x19a4U) goto LAB_0011e7db;
      uVar5 = uVar5 | *(uint *)(&DAT_001728f0 + (ulong)(*piVar7 - 0x19a4U) * 4);
      if (2 < piVar7[1] - 0x19a4U) {
        piVar7 = piVar7 + 1;
        goto LAB_0011e7db;
      }
      uVar5 = uVar5 | *(uint *)(&DAT_001728f0 + (ulong)(piVar7[1] - 0x19a4U) * 4);
      lVar8 = lVar8 + -1;
      piVar7 = piVar7 + 4;
    } while (1 < lVar8);
    count = count & 3;
  }
  if (count == 1) {
LAB_0011e6ca:
    piVar7 = pAVar6;
    if (2 < *pAVar6 - 0x19a4U) goto LAB_0011e7db;
    uVar5 = uVar5 | *(uint *)(&DAT_001728f0 + (ulong)(*pAVar6 - 0x19a4U) * 4);
  }
  else {
    if (count == 2) {
LAB_0011e6a5:
      piVar7 = pAVar6;
      if (*pAVar6 - 0x19a4U < 3) {
        uVar5 = uVar5 | *(uint *)(&DAT_001728f0 + (ulong)(*pAVar6 - 0x19a4U) * 4);
        pAVar6 = pAVar6 + 1;
        goto LAB_0011e6ca;
      }
    }
    else {
      if (count != 3) goto LAB_0011e7f9;
      piVar7 = pAVar6;
      if (*pAVar6 - 0x19a4U < 3) {
        uVar5 = uVar5 | *(uint *)(&DAT_001728f0 + (ulong)(*pAVar6 - 0x19a4U) * 4);
        pAVar6 = pAVar6 + 1;
        goto LAB_0011e6a5;
      }
    }
LAB_0011e7db:
    if (piVar7 != types + uVar1) {
      ALCcontext::setError(local_20,0xa002,"Invalid event type 0x%04x");
      goto LAB_0011e867;
    }
  }
LAB_0011e7f9:
  uVar2 = (local_20->mEnabledEvts).super___atomic_base<unsigned_int>._M_i;
  if (enable == '\0') {
    LOCK();
    uVar3 = (local_20->mEnabledEvts).super___atomic_base<unsigned_int>._M_i;
    bVar9 = uVar2 == uVar3;
    if (bVar9) {
      (local_20->mEnabledEvts).super___atomic_base<unsigned_int>._M_i = uVar2 & ~uVar5;
      uVar3 = uVar2;
    }
    UNLOCK();
    while (!bVar9) {
      LOCK();
      uVar2 = (local_20->mEnabledEvts).super___atomic_base<unsigned_int>._M_i;
      bVar9 = uVar3 == uVar2;
      if (bVar9) {
        (local_20->mEnabledEvts).super___atomic_base<unsigned_int>._M_i = uVar3 & ~uVar5;
        uVar2 = uVar3;
      }
      UNLOCK();
      uVar3 = uVar2;
    }
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)&local_20->mEventCbLock);
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&local_20->mEventCbLock);
  }
  else {
    LOCK();
    uVar3 = (local_20->mEnabledEvts).super___atomic_base<unsigned_int>._M_i;
    bVar9 = uVar2 == uVar3;
    if (bVar9) {
      (local_20->mEnabledEvts).super___atomic_base<unsigned_int>._M_i = uVar2 | uVar5;
      uVar3 = uVar2;
    }
    UNLOCK();
    while (!bVar9) {
      LOCK();
      uVar2 = (local_20->mEnabledEvts).super___atomic_base<unsigned_int>._M_i;
      bVar9 = uVar3 == uVar2;
      if (bVar9) {
        (local_20->mEnabledEvts).super___atomic_base<unsigned_int>._M_i = uVar3 | uVar5;
        uVar2 = uVar3;
      }
      UNLOCK();
      uVar3 = uVar2;
    }
  }
LAB_0011e867:
  if (local_20 != (ALCcontext *)0x0) {
    al::intrusive_ref<ALCcontext>::release(&local_20->super_intrusive_ref<ALCcontext>);
  }
  return;
}

Assistant:

AL_API void AL_APIENTRY alEventControlSOFT(ALsizei count, const ALenum *types, ALboolean enable)
START_API_FUNC
{
    ContextRef context{GetContextRef()};
    if UNLIKELY(!context) return;

    if(count < 0) context->setError(AL_INVALID_VALUE, "Controlling %d events", count);
    if(count <= 0) return;
    if(!types) SETERR_RETURN(context, AL_INVALID_VALUE,, "NULL pointer");

    ALbitfieldSOFT flags{0};
    const ALenum *types_end = types+count;
    auto bad_type = std::find_if_not(types, types_end,
        [&flags](ALenum type) noexcept -> bool
        {
            if(type == AL_EVENT_TYPE_BUFFER_COMPLETED_SOFT)
                flags |= EventType_BufferCompleted;
            else if(type == AL_EVENT_TYPE_SOURCE_STATE_CHANGED_SOFT)
                flags |= EventType_SourceStateChange;
            else if(type == AL_EVENT_TYPE_DISCONNECTED_SOFT)
                flags |= EventType_Disconnected;
            else
                return false;
            return true;
        }
    );
    if(bad_type != types_end)
        SETERR_RETURN(context, AL_INVALID_ENUM,, "Invalid event type 0x%04x", *bad_type);

    if(enable)
    {
        ALbitfieldSOFT enabledevts{context->mEnabledEvts.load(std::memory_order_relaxed)};
        while(context->mEnabledEvts.compare_exchange_weak(enabledevts, enabledevts|flags,
            std::memory_order_acq_rel, std::memory_order_acquire) == 0)
        {
            /* enabledevts is (re-)filled with the current value on failure, so
             * just try again.
             */
        }
    }
    else
    {
        ALbitfieldSOFT enabledevts{context->mEnabledEvts.load(std::memory_order_relaxed)};
        while(context->mEnabledEvts.compare_exchange_weak(enabledevts, enabledevts&~flags,
            std::memory_order_acq_rel, std::memory_order_acquire) == 0)
        {
        }
        /* Wait to ensure the event handler sees the changed flags before
         * returning.
         */
        std::lock_guard<std::mutex>{context->mEventCbLock};
    }
}